

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SplitNDLayerParams::SplitNDLayerParams
          (SplitNDLayerParams *this,SplitNDLayerParams *from)

{
  int new_size;
  void *pvVar1;
  uint64 uVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SplitNDLayerParams_00728c60;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->splitsizes_).current_size_ = 0;
  (this->splitsizes_).total_size_ = 0;
  (this->splitsizes_).rep_ = (Rep *)0x0;
  new_size = (from->splitsizes_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->splitsizes_,new_size);
    memcpy(((this->splitsizes_).rep_)->elements,((from->splitsizes_).rep_)->elements,
           (long)(from->splitsizes_).current_size_ << 3);
    (this->splitsizes_).current_size_ = (from->splitsizes_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar2 = from->numsplits_;
  this->axis_ = from->axis_;
  this->numsplits_ = uVar2;
  return;
}

Assistant:

SplitNDLayerParams::SplitNDLayerParams(const SplitNDLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      splitsizes_(from.splitsizes_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&axis_, &from.axis_,
    reinterpret_cast<char*>(&numsplits_) -
    reinterpret_cast<char*>(&axis_) + sizeof(numsplits_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SplitNDLayerParams)
}